

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O2

void __thiscall LibGens::Ym2612::specialUpdate(Ym2612 *this)

{
  if ((0 < this->m_writeLen) && (this->m_enabled == true)) {
    update(this,this->m_bufPtrL,this->m_bufPtrR,this->m_writeLen);
    this->m_writeLen = 0;
  }
  return;
}

Assistant:

void Ym2612::specialUpdate(void)
{
	if (!(m_writeLen > 0 && m_enabled))
		return;

	// Update the sound buffer.
	update(m_bufPtrL, m_bufPtrR, m_writeLen);
	m_writeLen = 0;

#if 0
	// TODO: Don't use EmuContext here...
	int line_num = 1;
	EmuContext *context = EmuContext::Instance();
	if (context != nullptr)
		line_num = (context->m_vdp->VDP_Lines.currentLine + 1);

	// Determine the new starting position.
	int writePos = SoundMgr::GetWritePos(line_num);

	// Update the PSG buffer pointers.
	m_bufPtrL = &SoundMgr::ms_SegBufL[writePos];
	m_bufPtrR = &SoundMgr::ms_SegBufR[writePos];
#endif
}